

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# central_freelist.cc
# Opt level: O2

bool tcmalloc::CentralFreeList::EvictRandomSizeClass(int locked_size_class,bool force)

{
  uint uVar1;
  bool bVar2;
  uint uVar3;
  
  uVar3 = EvictRandomSizeClass::race_counter;
  uVar1 = EvictRandomSizeClass::race_counter + 1;
  if (DAT_00158b10 <= (uint)EvictRandomSizeClass::race_counter) {
    uVar3 = EvictRandomSizeClass::race_counter + DAT_00158b10;
    do {
      uVar3 = uVar3 - DAT_00158b10;
      uVar1 = uVar3;
    } while (DAT_00158b10 <= uVar3);
  }
  EvictRandomSizeClass::race_counter = uVar1;
  if (uVar3 != locked_size_class) {
    bVar2 = ShrinkCache((CentralFreeList *)(Static::central_cache_ + (long)(int)uVar3 * 0x4c0),
                        locked_size_class,force);
    return bVar2;
  }
  return false;
}

Assistant:

bool CentralFreeList::EvictRandomSizeClass(
    int locked_size_class, bool force) {
  static int race_counter = 0;
  int t = race_counter++;  // Updated without a lock, but who cares.
  if (t >= Static::num_size_classes()) {
    while (t >= Static::num_size_classes()) {
      t -= Static::num_size_classes();
    }
    race_counter = t;
  }
  ASSERT(t >= 0);
  ASSERT(t < Static::num_size_classes());
  if (t == locked_size_class) return false;
  return Static::central_cache()[t].ShrinkCache(locked_size_class, force);
}